

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O1

void __thiscall
pbrt::UniformGridMediumProvider::UniformGridMediumProvider
          (UniformGridMediumProvider *this,Bounds3f *bounds,
          optional<pbrt::SampledGrid<float>_> *dgrid,
          optional<pbrt::SampledGrid<pbrt::RGB>_> *rgbgrid,RGBColorSpace *colorSpace,
          SpectrumHandle *Le,SampledGrid<float> *Legrid,Allocator alloc)

{
  undefined8 uVar1;
  size_t sVar2;
  float fVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_38;
  
  fVar3 = (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.z;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (bounds->pMax).super_Tuple3<pbrt::Point3,_float>.y;
  (this->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = fVar3;
  fVar3 = (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.y;
  uVar1 = *(undefined8 *)&(bounds->pMin).super_Tuple3<pbrt::Point3,_float>.z;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x =
       (bounds->pMin).super_Tuple3<pbrt::Point3,_float>.x;
  (this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y = fVar3;
  *(undefined8 *)&(this->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar1;
  pstd::optional<pbrt::SampledGrid<float>_>::optional(&this->densityGrid,dgrid);
  pstd::optional<pbrt::SampledGrid<pbrt::RGB>_>::optional(&this->rgbDensityGrid,rgbgrid);
  this->colorSpace = colorSpace;
  local_38.bits =
       (Le->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->Le_spec,(SpectrumHandle *)&local_38,0x168,0x33e,alloc);
  (this->LeScaleGrid).values.alloc.memoryResource = (Legrid->values).alloc.memoryResource;
  (this->LeScaleGrid).values.ptr = (float *)0x0;
  (this->LeScaleGrid).values.nAlloc = 0;
  (this->LeScaleGrid).values.nStored = 0;
  sVar2 = (Legrid->values).nStored;
  (this->LeScaleGrid).values.nAlloc = (Legrid->values).nAlloc;
  (this->LeScaleGrid).values.nStored = sVar2;
  (this->LeScaleGrid).values.ptr = (Legrid->values).ptr;
  (Legrid->values).nStored = 0;
  (Legrid->values).ptr = (float *)0x0;
  (Legrid->values).nAlloc = 0;
  (this->LeScaleGrid).nz = Legrid->nz;
  iVar4 = Legrid->ny;
  (this->LeScaleGrid).nx = Legrid->nx;
  (this->LeScaleGrid).ny = iVar4;
  lVar5 = (this->LeScaleGrid).values.nStored * 4 + *(long *)(in_FS_OFFSET + -0x1e0);
  *(long *)(in_FS_OFFSET + -0x1e0) = lVar5;
  if ((this->densityGrid).set == true) {
    lVar6 = *(long *)((long)&(this->densityGrid).optionalValue + 0x18) << 2;
  }
  else {
    if ((this->rgbDensityGrid).set == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x2f0d9cd);
    }
    lVar6 = *(long *)((long)&(this->rgbDensityGrid).optionalValue + 0x18) * 0xc;
  }
  *(long *)(in_FS_OFFSET + -0x1e0) = lVar6 + lVar5;
  return;
}

Assistant:

UniformGridMediumProvider::UniformGridMediumProvider(
    const Bounds3f &bounds, pstd::optional<SampledGrid<Float>> dgrid,
    pstd::optional<SampledGrid<RGB>> rgbgrid, const RGBColorSpace *colorSpace,
    SpectrumHandle Le, SampledGrid<Float> Legrid, Allocator alloc)
    : bounds(bounds),
      densityGrid(std::move(dgrid)),
      rgbDensityGrid(std::move(rgbgrid)),
      colorSpace(colorSpace),
      Le_spec(Le, alloc),
      LeScaleGrid(std::move(Legrid)) {
    volumeGridBytes += LeScaleGrid.BytesAllocated();
    volumeGridBytes +=
        densityGrid ? densityGrid->BytesAllocated() : rgbDensityGrid->BytesAllocated();
}